

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pager_write(PgHdr *pPg)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  PgHdr *in_RDI;
  i64 iOff;
  char *pData2;
  u32 cksum;
  int inJournal;
  int rc;
  Pager *pPager;
  PgHdr *in_stack_ffffffffffffffc8;
  i64 offset;
  Pager *in_stack_ffffffffffffffd0;
  sqlite3_file *fd;
  undefined4 in_stack_ffffffffffffffd8;
  u32 in_stack_ffffffffffffffdc;
  uint uVar4;
  Bitvec *p;
  
  p = (Bitvec *)in_RDI->pPager;
  uVar4 = 0;
  if (((p->u).aBitmap[4] == '\x02') &&
     (uVar4 = pager_open_journal((Pager *)CONCAT44(in_stack_ffffffffffffffdc,
                                                   in_stack_ffffffffffffffd8)), uVar4 != 0)) {
    return uVar4;
  }
  sqlite3PcacheMakeDirty((PgHdr *)0x134b0b);
  uVar1 = pageInJournal(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if ((uVar1 == 0) ||
     (((p->u).aHash[0x1c] != 0 &&
      (iVar2 = subjRequiresPage((PgHdr *)CONCAT44(in_stack_ffffffffffffffdc,
                                                  in_stack_ffffffffffffffd8)), iVar2 != 0)))) {
    if ((uVar1 == 0) && (iVar2 = pagerUseWal((Pager *)p), iVar2 == 0)) {
      if (((p->u).aHash[4] < in_RDI->pgno) ||
         (((sqlite3_file *)(p->u).apSub[8])->pMethods == (sqlite3_io_methods *)0x0)) {
        if ((p->u).aBitmap[4] != '\x04') {
          in_RDI->flags = in_RDI->flags | 4;
        }
      }
      else {
        offset = *(i64 *)((long)&p->u + 0x50);
        fd = (sqlite3_file *)in_RDI->pData;
        in_stack_ffffffffffffffdc = pager_cksum((Pager *)p,(u8 *)fd);
        in_RDI->flags = in_RDI->flags | 4;
        iVar2 = write32bits(fd,offset,0);
        if (iVar2 != 0) {
          return iVar2;
        }
        iVar2 = sqlite3OsWrite((sqlite3_file *)(ulong)uVar1,
                               (void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
                               ,(int)((ulong)fd >> 0x20),offset);
        if (iVar2 != 0) {
          return iVar2;
        }
        iVar2 = write32bits(fd,offset,0);
        if (iVar2 != 0) {
          return iVar2;
        }
        (p->u).apSub[10] =
             (Bitvec *)((long)&(p->u).apSub[10]->iSize + (long)(int)((p->u).aHash[0x2b] + 8));
        (p->u).aHash[8] = (p->u).aHash[8] + 1;
        uVar3 = sqlite3BitvecSet(p,0);
        uVar4 = addToSavepointBitvecs((Pager *)CONCAT44(uVar3,uVar1),in_stack_ffffffffffffffdc);
        uVar4 = uVar4 | uVar3;
        if (uVar4 != 0) {
          return uVar4;
        }
      }
    }
    if ((0 < (int)(p->u).aHash[0x1c]) &&
       (iVar2 = subjRequiresPage((PgHdr *)CONCAT44(in_stack_ffffffffffffffdc,
                                                   in_stack_ffffffffffffffd8)), iVar2 != 0)) {
      uVar4 = subjournalPage(in_RDI);
    }
  }
  if ((p->u).aHash[3] < in_RDI->pgno) {
    (p->u).aHash[3] = in_RDI->pgno;
  }
  return uVar4;
}

Assistant:

static int pager_write(PgHdr *pPg){
  Pager *pPager = pPg->pPager;
  int rc = SQLITE_OK;
  int inJournal;

  /* This routine is not called unless a write-transaction has already 
  ** been started. The journal file may or may not be open at this point.
  ** It is never called in the ERROR state.
  */
  assert( pPager->eState==PAGER_WRITER_LOCKED
       || pPager->eState==PAGER_WRITER_CACHEMOD
       || pPager->eState==PAGER_WRITER_DBMOD
  );
  assert( assert_pager_state(pPager) );
  assert( pPager->errCode==0 );
  assert( pPager->readOnly==0 );

  CHECK_PAGE(pPg);

  /* The journal file needs to be opened. Higher level routines have already
  ** obtained the necessary locks to begin the write-transaction, but the
  ** rollback journal might not yet be open. Open it now if this is the case.
  **
  ** This is done before calling sqlite3PcacheMakeDirty() on the page. 
  ** Otherwise, if it were done after calling sqlite3PcacheMakeDirty(), then
  ** an error might occur and the pager would end up in WRITER_LOCKED state
  ** with pages marked as dirty in the cache.
  */
  if( pPager->eState==PAGER_WRITER_LOCKED ){
    rc = pager_open_journal(pPager);
    if( rc!=SQLITE_OK ) return rc;
  }
  assert( pPager->eState>=PAGER_WRITER_CACHEMOD );
  assert( assert_pager_state(pPager) );

  /* Mark the page as dirty.  If the page has already been written
  ** to the journal then we can return right away.
  */
  sqlite3PcacheMakeDirty(pPg);
  inJournal = pageInJournal(pPager, pPg);
  if( inJournal && (pPager->nSavepoint==0 || !subjRequiresPage(pPg)) ){
    assert( !pagerUseWal(pPager) );
  }else{
  
    /* The transaction journal now exists and we have a RESERVED or an
    ** EXCLUSIVE lock on the main database file.  Write the current page to
    ** the transaction journal if it is not there already.
    */
    if( !inJournal && !pagerUseWal(pPager) ){
      assert( pagerUseWal(pPager)==0 );
      if( pPg->pgno<=pPager->dbOrigSize && isOpen(pPager->jfd) ){
        u32 cksum;
        char *pData2;
        i64 iOff = pPager->journalOff;

        /* We should never write to the journal file the page that
        ** contains the database locks.  The following assert verifies
        ** that we do not. */
        assert( pPg->pgno!=PAGER_MJ_PGNO(pPager) );

        assert( pPager->journalHdr<=pPager->journalOff );
        CODEC2(pPager, pPg->pData, pPg->pgno, 7, return SQLITE_NOMEM, pData2);
        cksum = pager_cksum(pPager, (u8*)pData2);

        /* Even if an IO or diskfull error occurs while journalling the
        ** page in the block above, set the need-sync flag for the page.
        ** Otherwise, when the transaction is rolled back, the logic in
        ** playback_one_page() will think that the page needs to be restored
        ** in the database file. And if an IO error occurs while doing so,
        ** then corruption may follow.
        */
        pPg->flags |= PGHDR_NEED_SYNC;

        rc = write32bits(pPager->jfd, iOff, pPg->pgno);
        if( rc!=SQLITE_OK ) return rc;
        rc = sqlite3OsWrite(pPager->jfd, pData2, pPager->pageSize, iOff+4);
        if( rc!=SQLITE_OK ) return rc;
        rc = write32bits(pPager->jfd, iOff+pPager->pageSize+4, cksum);
        if( rc!=SQLITE_OK ) return rc;

        IOTRACE(("JOUT %p %d %lld %d\n", pPager, pPg->pgno, 
                 pPager->journalOff, pPager->pageSize));
        PAGER_INCR(sqlite3_pager_writej_count);
        PAGERTRACE(("JOURNAL %d page %d needSync=%d hash(%08x)\n",
             PAGERID(pPager), pPg->pgno, 
             ((pPg->flags&PGHDR_NEED_SYNC)?1:0), pager_pagehash(pPg)));

        pPager->journalOff += 8 + pPager->pageSize;
        pPager->nRec++;
        assert( pPager->pInJournal!=0 );
        rc = sqlite3BitvecSet(pPager->pInJournal, pPg->pgno);
        testcase( rc==SQLITE_NOMEM );
        assert( rc==SQLITE_OK || rc==SQLITE_NOMEM );
        rc |= addToSavepointBitvecs(pPager, pPg->pgno);
        if( rc!=SQLITE_OK ){
          assert( rc==SQLITE_NOMEM );
          return rc;
        }
      }else{
        if( pPager->eState!=PAGER_WRITER_DBMOD ){
          pPg->flags |= PGHDR_NEED_SYNC;
        }
        PAGERTRACE(("APPEND %d page %d needSync=%d\n",
                PAGERID(pPager), pPg->pgno,
               ((pPg->flags&PGHDR_NEED_SYNC)?1:0)));
      }
    }
  
    /* If the statement journal is open and the page is not in it,
    ** then write the current page to the statement journal.  Note that
    ** the statement journal format differs from the standard journal format
    ** in that it omits the checksums and the header.
    */
    if( pPager->nSavepoint>0 && subjRequiresPage(pPg) ){
      rc = subjournalPage(pPg);
    }
  }

  /* Update the database size and return.
  */
  if( pPager->dbSize<pPg->pgno ){
    pPager->dbSize = pPg->pgno;
  }
  return rc;
}